

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  code *pcVar1;
  RenderContext *context;
  TestContext *testCtx;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *str;
  reference ppTVar6;
  Texture2D *pTVar7;
  TextureFormat *pTVar8;
  TestLog *pTVar9;
  NotSupportedError *this_00;
  MessageBuilder *pMVar10;
  reference pvVar11;
  undefined4 extraout_var_01;
  PixelFormat *pPVar12;
  size_type sVar13;
  Texture2DView TVar14;
  bool local_5c1;
  Texture2DView local_528;
  ConstPixelBufferAccess local_518;
  undefined1 local_4ed;
  float local_4ec;
  undefined1 auStack_4e8 [3];
  bool isOk;
  int iStack_4e4;
  int local_4e0;
  Vector<int,_3> local_4dc;
  Vector<float,_4> local_4d0;
  tcu local_4c0 [8];
  float afStack_4b8 [2];
  undefined1 local_4b0 [8];
  LookupPrecision lookupPrecision;
  LodPrecision lodPrecision;
  Vector<int,_4> local_468;
  Vector<int,_4> local_458;
  undefined1 local_448 [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_418 [7];
  bool isNearestOnly;
  MessageBuilder local_3f0;
  float local_270 [3];
  Sampler local_264;
  undefined1 local_228 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface rendered;
  ReferenceParams refParams;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ScopedLogSection local_80;
  ScopedLogSection section;
  FilterCase *curCase;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  RandomViewport viewport;
  Functions *gl;
  Texture2DFilteringCase *this_local;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  dVar4 = ::deInt32Hash(this->m_caseNdx);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&texFmt,(RenderTarget *)CONCAT44(extraout_var_00,iVar2),0x40,0x40,
             dVar3 ^ dVar4);
  ppTVar6 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                      (&this->m_textures,0);
  pTVar7 = glu::Texture2D::getRefTexture(*ppTVar6);
  pTVar8 = tcu::TextureLevelPyramid::getFormat(&pTVar7->super_TextureLevelPyramid);
  fmtInfo.lookupBias.m_data._8_8_ = *pTVar8;
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&curCase,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  section.m_log =
       (TestLog *)
       std::
       vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
       ::operator[](&this->m_cases,(long)this->m_caseNdx);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Test",&local_c1);
  de::toString<int>(&local_f8,&this->m_caseNdx);
  std::operator+(&local_a0,&local_c0,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Test ",&local_139);
  de::toString<int>((string *)&refParams.baseLevel,&this->m_caseNdx);
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &refParams.baseLevel);
  tcu::ScopedLogSection::ScopedLogSection(&local_80,pTVar9,&local_a0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&refParams.baseLevel);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),TEXTURETYPE_2D);
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_228);
  if ((0x3f < viewport.x) && (0x3f < viewport.y)) {
    glu::mapGLSampler(&local_264,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
    tcu::Sampler::operator=
              ((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_264);
    local_270[0] = fmtInfo.lookupBias.m_data[2];
    local_270[1] = fmtInfo.lookupBias.m_data[3];
    glu::TextureTestUtil::getSamplerType((TextureFormat)fmtInfo.lookupBias.m_data._8_8_);
    refParams.sampler.seamlessCubeMap = false;
    refParams.sampler._53_3_ = 0;
    refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
    refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
    refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
    refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
    refParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
    refParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
    refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
    refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
    pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3f0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_3f0,(char (*) [22])"Texture coordinates: ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(Vector<float,_2> *)(section.m_log + 1));
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])" -> ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(Vector<float,_2> *)(section.m_log + 2));
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3f0);
    glu::TextureTestUtil::computeQuadTexCoord2D
              ((vector<float,_std::allocator<float>_> *)local_228,(Vec2 *)(section.m_log + 1),
               (Vec2 *)(section.m_log + 2));
    pcVar1 = *(code **)(lVar5 + 0xb8);
    dVar3 = glu::Texture2D::getGLTexture((Texture2D *)(section.m_log)->m_log);
    (*pcVar1)(0xde1,dVar3);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar5 + 0x1a00))(texFmt.order,texFmt.type,viewport.x,viewport.y);
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_228,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,pvVar11,(RenderParams *)((long)&rendered.m_pixels.m_cap + 4));
    context = this->m_renderCtx;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)local_418,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    glu::readPixels(context,texFmt.order,texFmt.type,(PixelBufferAccess *)local_418);
    local_5c1 = false;
    if (this->m_minFilter == 0x2600) {
      local_5c1 = this->m_magFilter == 0x2600;
    }
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    pPVar12 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar2));
    colorBits.m_data[2] = pPVar12->redBits;
    colorBits.m_data[3] = pPVar12->greenBits;
    glu::TextureTestUtil::getBitsVec
              ((TextureTestUtil *)&local_468,(PixelFormat *)(colorBits.m_data + 2));
    tcu::operator-((tcu *)&local_458,&local_468,2 - (uint)local_5c1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&lodPrecision.derivateBits,0);
    tcu::max<int,4>((tcu *)local_448,&local_458,(Vector<int,_4> *)&lodPrecision.derivateBits);
    tcu::LodPrecision::LodPrecision
              ((LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),RULE_OPENGL);
    tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_4b0);
    lookupPrecision.colorMask.m_data[0] = true;
    lookupPrecision.colorMask.m_data[1] = false;
    lookupPrecision.colorMask.m_data[2] = false;
    lookupPrecision.colorMask.m_data[3] = false;
    lodPrecision.rule = 4;
    tcu::computeFixedPointThreshold((tcu *)&local_4d0,(IVec4 *)local_448);
    tcu::operator/(local_4c0,&local_4d0,(Vector<float,_4> *)&refParams.super_RenderParams.bias);
    lookupPrecision.uvwBits.m_data._4_8_ = local_4c0;
    lookupPrecision.colorThreshold.m_data[0] = afStack_4b8[0];
    lookupPrecision.colorThreshold.m_data[1] = afStack_4b8[1];
    tcu::Vector<int,_3>::Vector(&local_4dc,9,9,0);
    lookupPrecision.coordBits.m_data[0] = local_4dc.m_data[2];
    local_4b0._0_4_ = local_4dc.m_data[0];
    local_4b0._4_4_ = local_4dc.m_data[1];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)auStack_4e8,5,5,0);
    lookupPrecision.uvwBits.m_data[0] = local_4e0;
    lookupPrecision.coordBits.m_data[1] = _auStack_4e8;
    lookupPrecision.coordBits.m_data[2] = iStack_4e4;
    glu::TextureTestUtil::getCompareMask
              ((TextureTestUtil *)&local_4ec,(PixelFormat *)(colorBits.m_data + 2));
    lookupPrecision.colorThreshold.m_data[2] = local_4ec;
    testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&local_518,
               (Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    pTVar7 = glu::Texture2D::getRefTexture((Texture2D *)(section.m_log)->m_log);
    TVar14 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar7);
    local_528.m_levels = TVar14.m_levels;
    local_528.m_numLevels = TVar14.m_numLevels;
    pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)local_228,0);
    local_4ed = glu::TextureTestUtil::verifyTextureResult
                          (testCtx,&local_518,&local_528,pvVar11,
                           (ReferenceParams *)((long)&rendered.m_pixels.m_cap + 4),
                           (LookupPrecision *)local_4b0,
                           (LodPrecision *)(lookupPrecision.colorThreshold.m_data + 3),
                           (PixelFormat *)(colorBits.m_data + 2));
    if (!(bool)local_4ed) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    this->m_caseNdx = this->m_caseNdx + 1;
    iVar2 = this->m_caseNdx;
    sVar13 = std::
             vector<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
             ::size(&this->m_cases);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_228);
    tcu::Surface::~Surface
              ((Surface *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    tcu::ScopedLogSection::~ScopedLogSection(&local_80);
    return (uint)(iVar2 < (int)sVar13);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small viewport","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFilteringTests.cpp"
             ,0x113);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_renderCtx.getFunctions();
	const RandomViewport			viewport	(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::TextureFormat		texFmt		= m_textures[0]->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < MIN_VIEWPORT_WIDTH || viewport.height < MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], refParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 7;
		lodPrecision.lodBits			= 4;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(9,9,0); // mediump interpolation
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
											  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}